

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

bool __thiscall branch_and_reduce_algorithm::lpReduction(branch_and_reduce_algorithm *this)

{
  int iVar1;
  int iVar2;
  value_type vVar3;
  FILE *__stream;
  bool bVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  reference piVar8;
  undefined8 uVar9;
  int iVar10;
  int local_dc;
  string local_88;
  int local_64;
  int j;
  int u_1;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  int local_40;
  int iStack_3c;
  bool ok;
  int qt_1;
  int qs;
  int v_2;
  int i;
  int u;
  int v_1;
  int qt;
  int s;
  int local_18;
  int p;
  int v;
  int oldn;
  branch_and_reduce_algorithm *this_local;
  
  p = this->rn;
  _v = this;
  updateLP(this);
  for (local_18 = 0; local_18 < this->n; local_18 = local_18 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)local_18);
    if (((*pvVar5 < 0) && (bVar4 = fast_set::get(&this->used,local_18), bVar4)) &&
       (bVar4 = fast_set::get(&this->used,this->n + local_18), !bVar4)) {
      set(this,local_18,0);
    }
  }
  fast_set::clear(&this->used);
  s = 0;
  sVar6 = std::vector<int,_std::allocator<int>_>::size(&this->iter);
  qt = 0;
  std::vector<int,_std::allocator<int>_>::assign(&this->iter,sVar6,&qt);
  v_1 = 0;
  do {
    if (this->n <= v_1) {
      fast_set::clear(&this->used);
      qs = s;
      while (__stream = _stderr, qs = qs + -1, -1 < qs) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->level,(long)qs);
        bVar4 = fast_set::add(&this->used,*pvVar5);
        if (bVar4) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->level,(long)qs);
          vVar3 = *pvVar5;
          iStack_3c = 0;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->que,0);
          *pvVar5 = vVar3;
          local_40 = 1;
          while (iStack_3c < local_40) {
            iVar10 = iStack_3c + 1;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->que,(long)iStack_3c);
            iVar1 = *pvVar5;
            if (iVar1 < this->n) {
              local_dc = this->n;
            }
            else {
              local_dc = -this->n;
            }
            local_dc = iVar1 + local_dc;
            fast_set::get(&this->used,local_dc);
            iStack_3c = iVar10;
            if (iVar1 < this->n) {
              iVar10 = this->n;
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->out,(long)iVar1);
              bVar4 = fast_set::add(&this->used,iVar10 + *pvVar5);
              if (bVar4) {
                iVar10 = this->n;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->out,(long)iVar1);
                iVar1 = *pvVar5;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&this->que,(long)local_40);
                *pvVar5 = iVar10 + iVar1;
                local_40 = local_40 + 1;
              }
            }
            else {
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](&this->adj,(long)(iVar1 - this->n));
              __end5 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
              _j = std::vector<int,_std::allocator<int>_>::end(pvVar7);
              while (bVar4 = __gnu_cxx::operator!=
                                       (&__end5,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                                 *)&j), bVar4) {
                piVar8 = __gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&__end5);
                local_64 = *piVar8;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)local_64)
                ;
                if ((*pvVar5 < 0) &&
                   (bVar4 = fast_set::add(&this->used,local_64), iVar1 = local_64, bVar4)) {
                  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&this->que,(long)local_40);
                  *pvVar5 = iVar1;
                  local_40 = local_40 + 1;
                }
                __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++(&__end5);
              }
            }
          }
        }
      }
      if (((2 < debug) && (this->depth <= this->maxDepth)) && (p != this->rn)) {
        debugString_abi_cxx11_(&local_88,this);
        uVar9 = std::__cxx11::string::c_str();
        fprintf(__stream,"%sLP: %d -> %d\n",uVar9,(ulong)(uint)p,(ulong)(uint)this->rn);
        std::__cxx11::string::~string((string *)&local_88);
      }
      return p != this->rn;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)v_1);
    if ((*pvVar5 < 0) && (bVar4 = fast_set::add(&this->used,v_1), bVar4)) {
      u = 0;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->que,0);
      *pvVar5 = v_1;
      while (-1 < u) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->que,(long)u);
        iVar1 = *pvVar5;
        v_2 = -1;
        if (iVar1 < this->n) {
          do {
            v_2 = -1;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->iter,(long)iVar1);
            iVar10 = *pvVar5;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->adj,(long)iVar1);
            sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
            if ((int)sVar6 <= iVar10) break;
            iVar10 = this->n;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->adj,(long)iVar1);
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->iter,(long)iVar1);
            iVar2 = *pvVar5;
            *pvVar5 = iVar2 + 1;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)iVar2);
            v_2 = iVar10 + *pvVar5;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->x,(long)(v_2 - this->n));
          } while ((-1 < *pvVar5) || (bVar4 = fast_set::add(&this->used,v_2), !bVar4));
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->in,(long)(iVar1 - this->n));
          bVar4 = fast_set::add(&this->used,*pvVar5);
          if (bVar4) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->in,(long)(iVar1 - this->n));
            v_2 = *pvVar5;
          }
        }
        if (v_2 < 0) {
          sVar6 = (size_type)s;
          s = s + 1;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->level,sVar6);
          *pvVar5 = iVar1;
          u = u + -1;
        }
        else {
          u = u + 1;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->que,(long)u);
          *pvVar5 = v_2;
        }
      }
    }
    v_1 = v_1 + 1;
  } while( true );
}

Assistant:

bool branch_and_reduce_algorithm::lpReduction()
{
    int oldn = rn;
    updateLP();

#if 1
    for (int v = 0; v < n; v++)
    {
        if (x[v] < 0 && used.get(v) && !used.get(n + v))
            set(v, 0);
    }
    used.clear();
    int p = 0;
    iter.assign(iter.size(), 0);
    for (int s = 0; s < n; s++)
        if (x[s] < 0 && used.add(s))
        {
            int qt = 0;
            que[qt] = s;
            while (qt >= 0)
            {
                int v = que[qt], u = -1;
                if (v < n)
                {
                    while (iter[v] < static_cast<int>(adj[v].size()))
                    {
                        u = n + adj[v][iter[v]++];
                        if (x[u - n] < 0 && used.add(u))
                        {
                            break;
                        }
                        u = -1;
                    }
                }
                else if (used.add(in[v - n]))
                {
                    u = in[v - n];
                }
                if (u >= 0)
                {
                    que[++qt] = u;
                }
                else
                {
                    level[p++] = v;
                    qt--;
                }
            }
        }
    used.clear();
    for (int i = p - 1; i >= 0; i--)
        if (used.add(level[i]))
        {
            int v = level[i];
            int qs = 0, qt = 0;
            que[qt++] = v;
            bool ok = true;
            while (qs < qt)
            {
                v = que[qs++];
                if (used.get(v >= n ? (v - n) : (v + n)))
                    ok = false;
                if (v >= n)
                {
                    for (int u : adj[v - n])
                        if (x[u] < 0 && used.add(u))
                        {
                            que[qt++] = u;
                        }
                }
                else if (used.add(n + out[v]))
                {
                    que[qt++] = n + out[v];
                }
            }
            ok = false;
            if (ok)
            {
                for (int j = 0; j < qt; j++)
                {
                    v = que[j];
                    if (v >= n)
                        set(v - n, 0);
                }
            }
        }

#endif // 0
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sLP: %d -> %d\n", debugString().c_str(), oldn, rn);
    return oldn != rn;
}